

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<32U,_9U,_buffer_layout_dfs>::operator()
          (fill<32U,_9U,_buffer_layout_dfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  uchar *puVar1;
  int iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  uchar **ppuVar6;
  uchar **ppuVar7;
  unsigned_long *puVar8;
  long lVar9;
  size_t __n;
  size_t sVar10;
  fill<32U,_18U,_buffer_layout_dfs> local_64;
  fill<32U,_19U,_buffer_layout_dfs> local_63;
  fill<32U,_19U,_buffer_layout_dfs> local_62;
  fill<32U,_18U,_buffer_layout_dfs> local_61;
  uchar **begin;
  array<Stream,_32UL> *local_58;
  uchar **local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  uchar **local_38;
  
  puVar5 = buffer_count->_M_elems + 0x12;
  local_40 = buffer_count->_M_elems + 0x13;
  local_50 = buffer + 0x19b;
  local_38 = buffer + 0x1a3;
  begin = buffer + 0xe5;
  sVar10 = 0;
  lVar9 = 0;
  local_58 = streams;
  local_48 = puVar5;
  do {
    uVar3 = *puVar5;
    if (uVar3 == 0) {
      fill<32U,_18U,_buffer_layout_dfs>::operator()(&local_61,local_58,buffer,buffer_count);
      puVar5 = local_40;
      uVar3 = buffer_count->_M_elems[0x12];
      if (uVar3 == 0) {
        uVar3 = *local_40;
        __n = -lVar9;
        lVar9 = -sVar10;
        break;
      }
    }
    puVar8 = local_40;
    uVar4 = *local_40;
    if (uVar4 == 0) {
      fill<32U,_19U,_buffer_layout_dfs>::operator()(&local_62,local_58,buffer,buffer_count);
      uVar3 = buffer_count->_M_elems[0x12];
      uVar4 = buffer_count->_M_elems[0x13];
      if (uVar4 == 0) {
        __n = -lVar9;
        lVar9 = -sVar10;
        puVar5 = local_48;
        goto LAB_00169ca0;
      }
    }
    ppuVar7 = local_50 + -uVar3 + 8;
    ppuVar6 = local_38 + -uVar4 + 8;
    iVar2 = cmp(buffer[-uVar3 + 0x1a3],buffer[-uVar4 + 0x1ab]);
    puVar5 = local_48;
    if (iVar2 < 1) {
      puVar8 = local_48;
      ppuVar6 = ppuVar7;
    }
    puVar1 = *ppuVar6;
    *puVar8 = *puVar8 - 1;
    buffer[sVar10 + 0xe5] = puVar1;
    check_input(begin,sVar10);
    lVar9 = lVar9 + -8;
    sVar10 = sVar10 + 1;
    if (sVar10 == 0xb6) {
      buffer_count->_M_elems[9] = 0xb6;
      return;
    }
  } while( true );
  do {
    if (uVar3 == 0) {
      fill<32U,_19U,_buffer_layout_dfs>::operator()(&local_63,local_58,buffer,buffer_count);
      uVar3 = buffer_count->_M_elems[0x13];
      if (uVar3 == 0) {
        ppuVar6 = (uchar **)((long)local_50 - __n);
        ppuVar7 = buffer + lVar9 + 0x19b;
        goto LAB_00169d2f;
      }
    }
    *(uchar **)((long)buffer + __n + 0x728) = buffer[0x1ab - uVar3];
    uVar3 = uVar3 - 1;
    *puVar5 = uVar3;
    lVar9 = lVar9 + -1;
    __n = __n + 8;
  } while (__n != 0x5b0);
  goto LAB_00169cf5;
LAB_00169ca0:
  do {
    if (uVar3 == 0) {
      fill<32U,_18U,_buffer_layout_dfs>::operator()(&local_64,local_58,buffer,buffer_count);
      uVar3 = buffer_count->_M_elems[0x12];
      puVar5 = local_48;
      if (uVar3 == 0) {
        ppuVar7 = local_50 + lVar9;
        ppuVar6 = (uchar **)((long)local_50 - __n);
LAB_00169d2f:
        sVar10 = -lVar9;
        memmove(ppuVar7,begin,__n);
        buffer_count->_M_elems[9] = sVar10;
        goto LAB_00169d4e;
      }
    }
    *(uchar **)((long)buffer + __n + 0x728) = buffer[0x1a3 - uVar3];
    uVar3 = uVar3 - 1;
    *puVar5 = uVar3;
    lVar9 = lVar9 + -1;
    __n = __n + 8;
  } while (__n != 0x5b0);
LAB_00169cf5:
  buffer_count->_M_elems[9] = 0xb6;
  sVar10 = 0xb6;
  ppuVar6 = begin;
LAB_00169d4e:
  check_input(ppuVar6,sVar10);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}